

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

void __thiscall duckdb::ColumnWriterState::~ColumnWriterState(ColumnWriterState *this)

{
  ~ColumnWriterState(this);
  operator_delete(this);
  return;
}

Assistant:

ColumnWriterState::~ColumnWriterState() {
}